

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O1

int Curl_single_getsock(connectdata *conn,curl_socket_t *sock,int numsocks)

{
  uint uVar1;
  _func_int_connectdata_ptr_curl_socket_t_ptr_int *UNRECOVERED_JUMPTABLE;
  SessionHandle *pSVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  
  UNRECOVERED_JUMPTABLE = conn->handler->perform_getsock;
  if (UNRECOVERED_JUMPTABLE != (_func_int_connectdata_ptr_curl_socket_t_ptr_int *)0x0) {
    iVar3 = (*UNRECOVERED_JUMPTABLE)(conn,sock,numsocks);
    return iVar3;
  }
  uVar4 = 0;
  if (1 < numsocks) {
    pSVar2 = conn->data;
    bVar6 = ((pSVar2->req).keepon & 0x15U) == 1;
    if (bVar6) {
      *sock = conn->sockfd;
    }
    uVar4 = (uint)bVar6;
    uVar1 = (pSVar2->req).keepon;
    if ((uVar1 & 0x2a) == 2) {
      if (((uVar1 & 1) == 0) || (uVar5 = 0x10, conn->sockfd != conn->writesockfd)) {
        sock[uVar1 & 1] = conn->writesockfd;
        uVar5 = uVar1 & 1 | 0x10;
      }
      uVar4 = uVar4 | 1 << uVar5;
    }
  }
  return uVar4;
}

Assistant:

int Curl_single_getsock(const struct connectdata *conn,
                        curl_socket_t *sock, /* points to numsocks number
                                                of sockets */
                        int numsocks)
{
  const struct SessionHandle *data = conn->data;
  int bitmap = GETSOCK_BLANK;
  unsigned sockindex = 0;

  if(conn->handler->perform_getsock)
    return conn->handler->perform_getsock(conn, sock, numsocks);

  if(numsocks < 2)
    /* simple check but we might need two slots */
    return GETSOCK_BLANK;

  /* don't include HOLD and PAUSE connections */
  if((data->req.keepon & KEEP_RECVBITS) == KEEP_RECV) {

    DEBUGASSERT(conn->sockfd != CURL_SOCKET_BAD);

    bitmap |= GETSOCK_READSOCK(sockindex);
    sock[sockindex] = conn->sockfd;
  }

  /* don't include HOLD and PAUSE connections */
  if((data->req.keepon & KEEP_SENDBITS) == KEEP_SEND) {

    if((conn->sockfd != conn->writesockfd) ||
       !(data->req.keepon & KEEP_RECV)) {
      /* only if they are not the same socket or we didn't have a readable
         one, we increase index */
      if(data->req.keepon & KEEP_RECV)
        sockindex++; /* increase index if we need two entries */

      DEBUGASSERT(conn->writesockfd != CURL_SOCKET_BAD);

      sock[sockindex] = conn->writesockfd;
    }

    bitmap |= GETSOCK_WRITESOCK(sockindex);
  }

  return bitmap;
}